

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::RemoveLogSink(LogSink *destination)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  __first;
  LogSink *pLStack_10;
  
  pLStack_10 = destination;
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)LogDestination::sink_mutex_);
  this = LogDestination::sinks_;
  if (LogDestination::sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0
     ) {
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<google::LogSink**,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::LogSink*const>>
                        ((__normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                          )(LogDestination::sinks_->
                           super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                          )(LogDestination::sinks_->
                           super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish,&pLStack_10);
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::erase
              (this,(const_iterator)__first._M_current,
               (const_iterator)
               (LogDestination::sinks_->
               super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  return;
}

Assistant:

void RemoveLogSink(LogSink* destination) {
  LogDestination::RemoveLogSink(destination);
}